

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RippleOP.cpp
# Opt level: O2

void __thiscall
OpenMD::RippleOP::RippleOP
          (RippleOP *this,SimInfo *info,string *filename,string *sele1,string *sele2)

{
  SelectionManager *this_00;
  SelectionManager *this_01;
  SelectionEvaluator *this_02;
  SelectionEvaluator *this_03;
  string *script;
  int iVar1;
  int iVar2;
  StuntDouble *pSVar3;
  int j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  RippleOP *local_78;
  string *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  int i;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,1);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__RippleOP_002ee378;
  local_60 = sele1;
  std::__cxx11::string::string((string *)&this->selectionScript1_,(string *)sele1);
  local_68 = &this->selectionScript1_;
  local_58 = sele2;
  std::__cxx11::string::string((string *)&this->selectionScript2_,(string *)sele2);
  this_00 = &this->seleMan1_;
  local_70 = &this->selectionScript2_;
  SelectionManager::SelectionManager(this_00,info);
  this_01 = &this->seleMan2_;
  SelectionManager::SelectionManager(this_01,info);
  this_02 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_02,info);
  this_03 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(this_03,info);
  (this->orderParamsTail_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orderParamsTail_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->orderParamsHeadLower_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->orderParamsTail_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->orderParamsHeadLower_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->orderParamsHeadLower_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orderParamsHeadUpper_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orderParamsHeadUpper_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sdPairs_).
  super__Vector_base<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->orderParamsHeadUpper_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sdPairs_).
  super__Vector_base<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sdPairs_).
  super__Vector_base<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Vector<double,_3U>::Vector(&(this->avgOPHeadUpper).director.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->avgOPHeadLower).director.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->errOPHeadUpper).director.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->errOPHeadLower).director.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->avgOPTail).director.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->errOPTail).director.super_Vector<double,_3U>);
  local_78 = this;
  getPrefix((string *)&i,filename);
  std::operator+(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 ".rp2");
  script = local_58;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&i);
  SelectionEvaluator::loadScriptString(this_02,local_60);
  SelectionEvaluator::loadScriptString(this_03,script);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_98,this_02);
    SelectionManager::setSelectionSet(this_00,(SelectionSet *)&local_98);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_98);
  }
  else {
    builtin_strncpy(painCave.errMsg,"--sele1 must be static selection\n",0x22);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_98,this_03);
    SelectionManager::setSelectionSet(this_01,(SelectionSet *)&local_98);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_98);
  }
  else {
    builtin_strncpy(painCave.errMsg,"--sele2 must be static selection\n",0x22);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  iVar1 = SelectionManager::getSelectionCount(this_00);
  iVar2 = SelectionManager::getSelectionCount(this_01);
  if (iVar1 != iVar2) {
    memcpy(&painCave,"The number of selected Stuntdoubles are not the same in --sele1 and sele2\n",
           0x4b);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  pSVar3 = SelectionManager::beginSelected(this_00,&i);
  local_98._M_string_length = (size_type)SelectionManager::beginSelected(this_01,&j);
  while ((pSVar3 != (StuntDouble *)0x0 &&
         ((StuntDouble *)local_98._M_string_length != (StuntDouble *)0x0))) {
    local_98._M_dataplus._M_p = (pointer)pSVar3;
    std::
    vector<std::pair<OpenMD::StuntDouble*,OpenMD::StuntDouble*>,std::allocator<std::pair<OpenMD::StuntDouble*,OpenMD::StuntDouble*>>>
    ::emplace_back<std::pair<OpenMD::StuntDouble*,OpenMD::StuntDouble*>>
              ((vector<std::pair<OpenMD::StuntDouble*,OpenMD::StuntDouble*>,std::allocator<std::pair<OpenMD::StuntDouble*,OpenMD::StuntDouble*>>>
                *)&this->sdPairs_,(pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*> *)&local_98);
    pSVar3 = SelectionManager::nextSelected(this_00,&i);
    local_98._M_string_length = (size_type)SelectionManager::nextSelected(this_01,&j);
  }
  return;
}

Assistant:

RippleOP::RippleOP(SimInfo* info, const std::string& filename,
                     const std::string& sele1, const std::string& sele2) :
      StaticAnalyser(info, filename, 1),
      selectionScript1_(sele1), selectionScript2_(sele2), seleMan1_(info),
      seleMan2_(info), evaluator1_(info), evaluator2_(info) {
    setOutputName(getPrefix(filename) + ".rp2");

    evaluator1_.loadScriptString(sele1);
    evaluator2_.loadScriptString(sele2);

    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--sele1 must be static selection\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--sele2 must be static selection\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    if (seleMan1_.getSelectionCount() != seleMan2_.getSelectionCount()) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "The number of selected Stuntdoubles are not the same in --sele1 "
          "and sele2\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    int i;
    int j;
    StuntDouble* sd1;
    StuntDouble* sd2;
    for (sd1 = seleMan1_.beginSelected(i), sd2 = seleMan2_.beginSelected(j);
         sd1 != NULL && sd2 != NULL;
         sd1 = seleMan1_.nextSelected(i), sd2 = seleMan2_.nextSelected(j)) {
      sdPairs_.push_back(std::make_pair(sd1, sd2));
    }
  }